

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::Qrt(BN *__return_storage_ptr__,BN *this)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  long lVar7;
  undefined8 local_38;
  size_t j;
  bt4 cuv;
  size_t i;
  BN *this_local;
  BN *res;
  
  sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
  if (sVar4 < 0x10000fff9) {
    fastQrt(__return_storage_ptr__,this);
  }
  else {
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
    BN(__return_storage_ptr__,sVar4 * 2 + 1,0);
    for (cuv = 0; sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                                    (&this->ba), cuv < sVar4; cuv = cuv + 1) {
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&__return_storage_ptr__->ba,cuv << 1);
      uVar1 = *pvVar5;
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->ba,cuv);
      uVar2 = *pvVar6;
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&this->ba,cuv);
      uVar3 = (uint)uVar1 + (uint)uVar2 * (uint)*pvVar6;
      j = (size_t)uVar3;
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&__return_storage_ptr__->ba,cuv << 1);
      *pvVar5 = (value_type)uVar3;
      local_38 = cuv;
      while( true ) {
        local_38 = local_38 + 1;
        sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
        if (sVar4 <= local_38) break;
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&__return_storage_ptr__->ba,cuv + local_38);
        uVar1 = *pvVar5;
        pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->ba,cuv);
        uVar2 = *pvVar6;
        pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&this->ba,local_38);
        j = (ulong)uVar1 + (ulong)uVar2 * (ulong)*pvVar6 * 2 + (j >> 0x10);
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (&__return_storage_ptr__->ba,cuv + local_38);
        *pvVar5 = (value_type)j;
      }
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&__return_storage_ptr__->ba,cuv + sVar4);
      lVar7 = (ulong)*pvVar5 + (j >> 0x10);
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&__return_storage_ptr__->ba,cuv + sVar4);
      *pvVar5 = (value_type)lVar7;
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&__return_storage_ptr__->ba,cuv + sVar4 + 1);
      *pvVar5 = *pvVar5 + (short)((ulong)lVar7 >> 0x10);
    }
    anon_unknown.dwarf_977c::Norm(&__return_storage_ptr__->ba);
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::Qrt() const
{
    if (ba.size() < MaximalSizeForFastMul)
        return fastQrt();

    BN res(2 * ba.size() + 1, 0);
    for (size_t i = 0; i < ba.size(); ++i) {
        bt4 cuv = res.ba[2 * i] + static_cast<bt2>(ba[i]) * ba[i];
        res.ba[2 * i] = cuv;
        for (size_t j = i + 1; j < ba.size(); ++j) {
            cuv = static_cast<bt4>(res.ba[i + j]) +
                ((static_cast<bt4>(ba[i]) * ba[j]) << 1) +
                (cuv >> bz8);
            res.ba[i + j] = cuv;
        }
        cuv = res.ba[i + ba.size()] + (cuv >> bz8);
        res.ba[i + ba.size()] = cuv;
        res.ba[i + ba.size() + 1] += (cuv >> bz8);
    }
    Norm(res.ba);
    return res;
}